

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_unittest.h
# Opt level: O1

void __thiscall
google::protobuf::internal::
Proto3PrimitiveRepeatedWireFormatTest<void_(proto3_arena_unittest::TestAllTypes,_proto3_arena_unittest::TestUnpackedTypes)>
::SetProto3PrimitiveRepeatedFields<proto3_arena_unittest::TestAllTypes>
          (Proto3PrimitiveRepeatedWireFormatTest<void_(proto3_arena_unittest::TestAllTypes,_proto3_arena_unittest::TestUnpackedTypes)>
           *this,TestAllTypes *message)

{
  RepeatedField<int>::Add(&(message->field_0)._impl_.repeated_int32_,1);
  RepeatedField<long>::Add(&(message->field_0)._impl_.repeated_int64_,1);
  RepeatedField<unsigned_int>::Add(&(message->field_0)._impl_.repeated_uint32_,1);
  RepeatedField<unsigned_long>::Add(&(message->field_0)._impl_.repeated_uint64_,1);
  RepeatedField<int>::Add(&(message->field_0)._impl_.repeated_sint32_,1);
  RepeatedField<long>::Add(&(message->field_0)._impl_.repeated_sint64_,1);
  RepeatedField<unsigned_int>::Add(&(message->field_0)._impl_.repeated_fixed32_,1);
  RepeatedField<unsigned_long>::Add(&(message->field_0)._impl_.repeated_fixed64_,1);
  RepeatedField<int>::Add(&(message->field_0)._impl_.repeated_sfixed32_,1);
  RepeatedField<long>::Add(&(message->field_0)._impl_.repeated_sfixed64_,1);
  RepeatedField<float>::Add(&(message->field_0)._impl_.repeated_float_,1.0);
  RepeatedField<double>::Add(&(message->field_0)._impl_.repeated_double_,1.0);
  RepeatedField<bool>::Add(&(message->field_0)._impl_.repeated_bool_,true);
  RepeatedField<int>::Add(&(message->field_0)._impl_.repeated_nested_enum_,1);
  return;
}

Assistant:

void SetProto3PrimitiveRepeatedFields(Proto* message) {
    message->add_repeated_int32(1);
    message->add_repeated_int64(1);
    message->add_repeated_uint32(1);
    message->add_repeated_uint64(1);
    message->add_repeated_sint32(1);
    message->add_repeated_sint64(1);
    message->add_repeated_fixed32(1);
    message->add_repeated_fixed64(1);
    message->add_repeated_sfixed32(1);
    message->add_repeated_sfixed64(1);
    message->add_repeated_float(1.0);
    message->add_repeated_double(1.0);
    message->add_repeated_bool(true);
    message->add_repeated_nested_enum(TestAllTypes::FOO);
  }